

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O2

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<int>(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
              *this,int aValue,int aBase,uint8_t aFill)

{
  char *pcVar1;
  ulong uVar2;
  Iterator pcVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  Iterator pcVar8;
  ulong uVar9;
  ulong uVar10;
  char tmpBuffer [100];
  
  if (0xfffffff0 < aBase - 0x11U) {
    if (aBase == 0x10) {
      pcVar3 = this->mBegin;
      pcVar8 = this->mEnd;
      if (pcVar3 < pcVar8) {
        *pcVar3 = '0';
        pcVar8 = this->mEnd;
        pcVar3 = this->mBegin + 1;
        this->mBegin = pcVar3;
      }
      if (pcVar3 < pcVar8) {
        *pcVar3 = 'x';
        goto LAB_001043a4;
      }
    }
    else if (aBase != 10) {
      if (aBase == 2) {
        pcVar3 = this->mBegin;
        pcVar8 = this->mEnd;
        if (pcVar3 < pcVar8) {
          *pcVar3 = '0';
          pcVar8 = this->mEnd;
          pcVar3 = this->mBegin + 1;
          this->mBegin = pcVar3;
        }
        if (pcVar3 < pcVar8) {
          *pcVar3 = 'b';
LAB_001043a4:
          this->mBegin = this->mBegin + 1;
        }
      }
      else {
        pcVar3 = this->mBegin;
        pcVar8 = this->mEnd;
        if (pcVar3 < pcVar8) {
          *pcVar3 = '0';
          pcVar8 = this->mEnd;
          pcVar3 = this->mBegin + 1;
          this->mBegin = pcVar3;
        }
        if (pcVar3 < pcVar8) {
          *pcVar3 = '!';
          goto LAB_001043a4;
        }
      }
    }
    uVar2 = (ulong)(uint)aValue;
    uVar4 = 0;
    do {
      uVar9 = uVar4;
      iVar7 = (int)uVar2;
      uVar2 = (long)iVar7 / (long)aBase;
      uVar4 = (long)iVar7 % (long)aBase;
      iVar7 = (int)uVar4;
      uVar10 = (ulong)(uint)-iVar7;
      if (0 < iVar7) {
        uVar10 = uVar4 & 0xffffffff;
      }
      tmpBuffer[uVar9] = "0123456789abcdef"[uVar10];
      uVar4 = uVar9 + 1;
    } while ((uVar9 < 99) && ((int)uVar2 != 0));
    if (uVar9 < 99) {
      if ((aValue < 0) && (this->mBegin < this->mEnd)) {
        *this->mBegin = '-';
        this->mBegin = this->mBegin + 1;
      }
      if ((byte)uVar4 < aFill) {
        uVar6 = (uint)aFill - (int)uVar4;
        while (cVar5 = (char)uVar6, uVar6 = (uint)(byte)(cVar5 - 1), cVar5 != '\0') {
          if (this->mBegin < this->mEnd) {
            *this->mBegin = '0';
            this->mBegin = this->mBegin + 1;
          }
        }
      }
      while( true ) {
        uVar4 = uVar9;
        pcVar1 = this->mBegin;
        if (uVar4 == 0) break;
        uVar9 = uVar4 - 1;
        if (pcVar1 < this->mEnd) {
          *pcVar1 = tmpBuffer[uVar4];
          this->mBegin = this->mBegin + 1;
        }
      }
      if (this->mEnd <= pcVar1) {
        return;
      }
      *pcVar1 = tmpBuffer[0];
      goto LAB_00104450;
    }
  }
  if (this->mEnd <= this->mBegin) {
    return;
  }
  *this->mBegin = '#';
LAB_00104450:
  this->mBegin = this->mBegin + 1;
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }